

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

int portability_path_separator_normalize_inplace(char *path,size_t size)

{
  int iVar1;
  size_t sVar2;
  char cVar3;
  
  if (path == (char *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    cVar3 = '\0';
    for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
      if ((path[sVar2] == '\\') || (path[sVar2] == '/')) {
        if (cVar3 == '\0') {
          cVar3 = '/';
        }
        else {
          path[sVar2] = cVar3;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int portability_path_separator_normalize_inplace(char *path, size_t size)
{
	if (path == NULL)
	{
		return 1;
	}

	size_t iterator;
	char separator = 0;

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (PORTABILITY_PATH_SEPARATOR_ALL(path[iterator]))
		{
			if (separator == 0)
			{
				separator = PORTABILITY_PATH_SEPARATOR_C; /* Use current platform style as default */
			}
			else
			{
				path[iterator] = separator;
			}
		}
	}

	return 0;
}